

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_loaded_list.h
# Opt level: O1

loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>_>
* __thiscall
omp::make_loaded_list<(anonymous_namespace)::IIntegerManager,std::vector<int,std::allocator<int>>>
          (loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>_>
           *__return_storage_ptr__,omp *this,
          shared_ptr<(anonymous_namespace)::IIntegerManager> *list,
          vector<int,_std::allocator<int>_> *args)

{
  undefined8 *puVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  
  puVar1 = *(undefined8 **)this;
  peVar2 = (list->
           super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = list[1].
           super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (list->super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  (list->super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  list[1].super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (**(code **)*puVar1)();
  if (peVar2 != (element_type *)0x0) {
    operator_delete(peVar2,(long)peVar3 - (long)peVar2);
  }
  (__return_storage_ptr__->
  super_shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>
  ).list.super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)this;
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  (__return_storage_ptr__->
  super_shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>
  ).list.super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  __return_storage_ptr__->count = 0;
  peVar2 = (__return_storage_ptr__->
           super_shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>
           ).list.
           super___shared_ptr<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar2->_vptr_IIntegerManager[1])(peVar2,&__return_storage_ptr__->count);
  return __return_storage_ptr__;
}

Assistant:

auto make_loaded_list(const std::shared_ptr<T> &list, Args &&...args) {
  using record_by_index = get_record_by_index_<decltype(&T::GetRecordByIndex)>;

  using value_type =
      std::remove_pointer_t<typename record_by_index::value_type>;

  list->LoadDataList(std::forward<Args>(args)...);

  return loaded_list_wrapper<
      shared_ptr_wrapper<T, typename record_by_index::index_type, value_type>>(
      list);
}